

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_utils.c
# Opt level: O0

int mk_utils_gmt_cache_get(char **data,time_t date)

{
  char *pcVar1;
  void *pvVar2;
  mk_gmt_cache *gcache;
  uint i;
  time_t date_local;
  char **data_local;
  
  pvVar2 = pthread_getspecific(mk_tls_cache_gmtext);
  if (pvVar2 != (void *)0x0) {
    for (gcache._4_4_ = 0; gcache._4_4_ < 10; gcache._4_4_ = gcache._4_4_ + 1) {
      if (date == *(long *)((long)pvVar2 + (ulong)gcache._4_4_ * 0x30)) {
        pcVar1 = *data;
        *(undefined8 *)pcVar1 = *(undefined8 *)((long)pvVar2 + (ulong)gcache._4_4_ * 0x30 + 8);
        *(undefined8 *)(pcVar1 + 8) =
             *(undefined8 *)((long)pvVar2 + (ulong)gcache._4_4_ * 0x30 + 0x10);
        *(undefined8 *)(pcVar1 + 0x10) =
             *(undefined8 *)((long)pvVar2 + (ulong)gcache._4_4_ * 0x30 + 0x18);
        *(undefined8 *)(pcVar1 + 0x18) =
             *(undefined8 *)((long)pvVar2 + (ulong)gcache._4_4_ * 0x30 + 0x20);
        *(long *)((long)pvVar2 + (ulong)gcache._4_4_ * 0x30 + 0x28) =
             *(long *)((long)pvVar2 + (ulong)gcache._4_4_ * 0x30 + 0x28) + 1;
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

static int mk_utils_gmt_cache_get(char **data, time_t date)
{
    unsigned int i;
    struct mk_gmt_cache *gcache = MK_TLS_GET(mk_tls_cache_gmtext);

    if (mk_unlikely(!gcache)) {
        return MK_FALSE;
    }

    for (i = 0; i < MK_GMT_CACHES; i++) {
        if (date == gcache[i].time) {
            memcpy(*data, gcache[i].text, 32);
            gcache[i].hits++;
            return MK_TRUE;
        }
    }

    return MK_FALSE;
}